

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

Section __thiscall QDateTimeEdit::currentSection(QDateTimeEdit *this)

{
  Section s;
  Section SVar1;
  QDateTimeEditPrivate *pQVar2;
  QDateTimeEditPrivate *d;
  
  pQVar2 = d_func((QDateTimeEdit *)0x559907);
  s = QDateTimeParser::sectionType((int)pQVar2 + 0x3d8);
  SVar1 = QDateTimeEditPrivate::convertToPublic(s);
  return SVar1;
}

Assistant:

QDateTimeEdit::Section QDateTimeEdit::currentSection() const
{
    Q_D(const QDateTimeEdit);
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled() && d->focusOnButton)
        return NoSection;
#endif
    return QDateTimeEditPrivate::convertToPublic(d->sectionType(d->currentSectionIndex));
}